

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenPadding(SwiftGenerator *this,FieldDef *field,int *id)

{
  int t;
  string local_f8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  int bits;
  int i;
  int *id_local;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  if (field->padding != 0) {
    _bits = id;
    id_local = (int *)field;
    field_local = (FieldDef *)this;
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      if (((uint)*(undefined8 *)(id_local + 0x4a) & 1 << ((byte)local_24 & 0x1f)) != 0) {
        local_28 = (1 << ((byte)local_24 & 0x1f)) << 3;
        t = *_bits;
        *_bits = t + 1;
        NumToString<int>(&local_c8,t);
        std::operator+(&local_a8,"private let padding",&local_c8);
        std::operator+(&local_88,&local_a8,"__: UInt");
        NumToString<int>(&local_f8,local_28);
        std::operator+(&local_68,&local_88,&local_f8);
        std::operator+(&local_48,&local_68," = 0");
        CodeWriter::operator+=(&this->code_,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
    if ((*(ulong *)(id_local + 0x4a) & 0xfffffffffffffff0) != 0) {
      __assert_fail("!(field.padding & ~0xF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                    ,0x6eb,
                    "void flatbuffers::swift::SwiftGenerator::GenPadding(const FieldDef &, int *)");
    }
  }
  return;
}

Assistant:

inline void GenPadding(const FieldDef &field, int *id) {
    if (field.padding) {
      for (int i = 0; i < 4; i++) {
        if (static_cast<int>(field.padding) & (1 << i)) {
          const auto bits = (1 << i) * 8;
          code_ += "private let padding" + NumToString((*id)++) + "__: UInt" +
                   NumToString(bits) + " = 0";
        }
      }
      FLATBUFFERS_ASSERT(!(field.padding & ~0xF));
    }
  }